

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O0

LY_ERR lys_apply_deviation(lysc_ctx *ctx,lysp_deviation *dev,lysp_module *dev_pmod,lysp_node *target
                          )

{
  char cVar1;
  lys_module *plVar2;
  ly_ctx *ctx_00;
  ly_stmt parent_stmt;
  size_t sVar3;
  lysp_ext_instance *local_10a8;
  lysp_ext_instance *local_1098;
  lysp_ext_instance *local_1088;
  lysp_ext_instance *local_1080;
  lysp_ext_instance *local_1068;
  long *plStack_1058;
  LY_ERR ret__;
  char *p__;
  uint64_t __new_start;
  uint64_t __u;
  lysp_deviate *d;
  char orig_path [4078];
  lysp_module *orig_pmod;
  lys_module *orig_mod;
  LY_ERR ret;
  lysp_node *target_local;
  lysp_module *dev_pmod_local;
  lysp_deviation *dev_local;
  lysc_ctx *ctx_local;
  
  orig_mod._4_4_ = LY_SUCCESS;
  plVar2 = ctx->cur_mod;
  unique0x00012000 = ctx->pmod;
  strcpy((char *)&d,ctx->path);
  ctx->path_len = 1;
  ctx->cur_mod = dev_pmod->mod;
  ctx->pmod = dev_pmod;
  lysc_update_path(ctx,(lys_module *)0x0,"{deviation}");
  lysc_update_path(ctx,(lys_module *)0x0,dev->nodeid);
  for (__u = (uint64_t)dev->deviates; __u != 0; __u = *(uint64_t *)(__u + 8)) {
    cVar1 = *(char *)__u;
    if (cVar1 == '\x02') {
      orig_mod._4_4_ = lys_apply_deviate_add(ctx,(lysp_deviate_add *)__u,target);
    }
    else if (cVar1 == '\x03') {
      orig_mod._4_4_ = lys_apply_deviate_delete(ctx,(lysp_deviate_del *)__u,target);
    }
    else if (cVar1 == '\x04') {
      orig_mod._4_4_ = lys_apply_deviate_replace(ctx,(lysp_deviate_rpl *)__u,target);
    }
    else {
      ly_log(ctx->ctx,LY_LLERR,LY_EINT,"Internal error (%s:%d).",
             "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile_amend.c"
             ,0x62f);
      orig_mod._4_4_ = LY_EINT;
    }
    if (orig_mod._4_4_ != LY_SUCCESS) goto LAB_0017d308;
  }
  if (dev->exts == (lysp_ext_instance *)0x0) {
LAB_0017d308:
    ctx->cur_mod = plVar2;
    ctx->pmod = stack0xffffffffffffffb8;
    strcpy(ctx->path,(char *)&d);
    sVar3 = strlen(ctx->path);
    ctx->path_len = (uint32_t)sVar3;
    ctx_local._4_4_ = orig_mod._4_4_;
  }
  else {
    if (target->exts == (lysp_ext_instance *)0x0) {
      local_1068 = (lysp_ext_instance *)0x0;
    }
    else {
      local_1068 = target->exts[-1].exts;
    }
    if (target->exts == (lysp_ext_instance *)0x0) {
      if (dev->exts == (lysp_ext_instance *)0x0) {
        local_1088 = (lysp_ext_instance *)0x0;
      }
      else {
        local_1088 = dev->exts[-1].exts;
      }
      plStack_1058 = (long *)calloc(1,(long)local_1088 * 0x70 + 8);
      if (plStack_1058 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_deviation");
        return LY_EMEM;
      }
    }
    else {
      if (dev->exts == (lysp_ext_instance *)0x0) {
        local_1080 = (lysp_ext_instance *)0x0;
      }
      else {
        local_1080 = dev->exts[-1].exts;
      }
      plStack_1058 = (long *)realloc(&target->exts[-1].exts,
                                     ((long)&local_1080->name + (long)&(target->exts[-1].exts)->name
                                     ) * 0x70 + 8);
      if (plStack_1058 == (long *)0x0) {
        ly_log(ctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lys_apply_deviation");
        return LY_EMEM;
      }
    }
    target->exts = (lysp_ext_instance *)(plStack_1058 + 1);
    if (target->exts != (lysp_ext_instance *)0x0) {
      if (dev->exts == (lysp_ext_instance *)0x0) {
        local_1098 = (lysp_ext_instance *)0x0;
      }
      else {
        local_1098 = dev->exts[-1].exts;
      }
      memset(target->exts + *plStack_1058,0,(long)local_1098 * 0x70);
    }
    __new_start = 0;
    while( true ) {
      if (dev->exts == (lysp_ext_instance *)0x0) {
        local_10a8 = (lysp_ext_instance *)0x0;
      }
      else {
        local_10a8 = dev->exts[-1].exts;
      }
      if (local_10a8 <= __new_start) goto LAB_0017d308;
      target->exts[-1].exts = (lysp_ext_instance *)((long)&(target->exts[-1].exts)->name + 1);
      ctx_00 = ctx->ctx;
      parent_stmt = lyplg_ext_nodetype2stmt(target->nodetype);
      ctx_local._4_4_ =
           lysp_ext_dup(ctx_00,dev_pmod,target,parent_stmt,dev->exts + __new_start,
                        target->exts + (long)&local_1068->name + __new_start);
      if (ctx_local._4_4_ != LY_SUCCESS) break;
      __new_start = __new_start + 1;
    }
  }
  return ctx_local._4_4_;
}

Assistant:

static LY_ERR
lys_apply_deviation(struct lysc_ctx *ctx, struct lysp_deviation *dev, const struct lysp_module *dev_pmod,
        struct lysp_node *target)
{
    LY_ERR ret = LY_SUCCESS;
    struct lys_module *orig_mod = ctx->cur_mod;
    struct lysp_module *orig_pmod = ctx->pmod;
    char orig_path[LYSC_CTX_BUFSIZE];
    struct lysp_deviate *d;

    /* clear path and set modules */
    strcpy(orig_path, ctx->path);
    ctx->path_len = 1;
    ctx->cur_mod = dev_pmod->mod;
    ctx->pmod = (struct lysp_module *)dev_pmod;

    /* generate correct path */
    lysc_update_path(ctx, NULL, "{deviation}");
    lysc_update_path(ctx, NULL, dev->nodeid);

    LY_LIST_FOR(dev->deviates, d) {
        switch (d->mod) {
        case LYS_DEV_ADD:
            ret = lys_apply_deviate_add(ctx, (struct lysp_deviate_add *)d, target);
            break;
        case LYS_DEV_DELETE:
            ret = lys_apply_deviate_delete(ctx, (struct lysp_deviate_del *)d, target);
            break;
        case LYS_DEV_REPLACE:
            ret = lys_apply_deviate_replace(ctx, (struct lysp_deviate_rpl *)d, target);
            break;
        default:
            LOGINT(ctx->ctx);
            ret = LY_EINT;
        }
        LY_CHECK_GOTO(ret, cleanup);
    }

    /* deviation extension instances */
    DUP_EXTS(ctx->ctx, dev_pmod, target, lyplg_ext_nodetype2stmt(target->nodetype), dev->exts, target->exts, lysp_ext_dup);

cleanup:
    ctx->cur_mod = orig_mod;
    ctx->pmod = orig_pmod;

    strcpy(ctx->path, orig_path);
    ctx->path_len = strlen(ctx->path);
    return ret;
}